

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int float128_lt_quiet_mipsel(float128 a,float128 b,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  uVar2 = b.high;
  uVar3 = b.low;
  uVar4 = a.high;
  uVar5 = a.low;
  uVar1 = 0xffffffffffff;
  if ((((~uVar4 & 0x7fff000000000000) == 0) &&
      (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       uVar5 != 0)) ||
     (((~uVar2 & 0x7fff000000000000) == 0 &&
      (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       uVar3 != 0)))) {
    if (status->snan_bit_is_one == '\0') {
      if (((uVar4 & 0x7fff800000000000) == 0x7fff000000000000) &&
         (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
          uVar5 != 0)) goto LAB_007cbd95;
      if ((uVar2 & 0x7fff800000000000) == 0x7fff000000000000) {
        uVar1 = 0x7fffffffffff;
        goto LAB_007cbd8d;
      }
    }
    else if (((a.high._4_4_ >> 0xf & 0xffff) < 0xffff) ||
            (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
             uVar5 == 0)) {
      if (0xfffeffffffffffff < uVar2 * 2) {
LAB_007cbd8d:
        if (uVar3 != 0 || (uVar2 & uVar1) != 0) goto LAB_007cbd95;
      }
    }
    else {
LAB_007cbd95:
      status->float_exception_flags = status->float_exception_flags | 1;
    }
  }
  else {
    if (-1 < (long)(uVar2 ^ uVar4)) {
      if ((long)uVar4 < 0) {
        bVar6 = uVar2 < uVar4;
        bVar7 = uVar3 < uVar5;
      }
      else {
        bVar6 = uVar4 < uVar2;
        bVar7 = uVar5 < uVar3;
      }
      bVar6 = (bool)(bVar7 & uVar4 == uVar2 | bVar6);
      goto LAB_007cbdba;
    }
    if ((long)uVar4 < 0) {
      bVar6 = (((uVar2 | uVar4) & 0x7fffffffffffffff) != 0 || uVar5 != 0) || uVar3 != 0;
      goto LAB_007cbdba;
    }
  }
  bVar6 = false;
LAB_007cbdba:
  return (int)bVar6;
}

Assistant:

int float128_lt_quiet(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign;

    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        if (float128_is_signaling_nan(a, status)
         || float128_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloat128Sign( a );
    bSign = extractFloat128Sign( b );
    if ( aSign != bSign ) {
        return
               aSign
            && (    ( ( (uint64_t) ( ( a.high | b.high )<<1 ) ) | a.low | b.low )
                 != 0 );
    }
    return
          aSign ? lt128( b.high, b.low, a.high, a.low )
        : lt128( a.high, a.low, b.high, b.low );

}